

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O3

string * __thiscall
deqp::egl::MakeCurrentPerfCase::Spec::toName_abi_cxx11_(string *__return_storage_ptr__,Spec *this)

{
  SurfaceType SVar1;
  bool *pbVar2;
  ostringstream name;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"context",7);
  if (1 < this->contextCount) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"s_",2);
    std::ostream::operator<<(local_190,this->contextCount);
  }
  SVar1 = this->surfaceTypes;
  if ((SVar1 & SURFACETYPE_WINDOW) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_window",7);
    pbVar2 = glcts::fixed_sample_locations_values + 1;
    if (1 < this->surfaceCount) {
      pbVar2 = (bool *)0x1c21c7b;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,pbVar2,(ulong)(1 < this->surfaceCount));
    SVar1 = this->surfaceTypes;
  }
  if ((SVar1 & SURFACETYPE_PIXMAP) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_pixmap",7);
    pbVar2 = glcts::fixed_sample_locations_values + 1;
    if (1 < this->surfaceCount) {
      pbVar2 = (bool *)0x1c21c7b;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,pbVar2,(ulong)(1 < this->surfaceCount));
    SVar1 = this->surfaceTypes;
  }
  if ((SVar1 & SURFACETYPE_PBUFFER) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_pbuffer",8);
    pbVar2 = glcts::fixed_sample_locations_values + 1;
    if (1 < this->surfaceCount) {
      pbVar2 = (bool *)0x1c21c7b;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,pbVar2,(ulong)(1 < this->surfaceCount));
  }
  if (1 < this->surfaceCount) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_",1);
    std::ostream::operator<<(local_190,this->surfaceCount);
  }
  if (this->release == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_release",8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string MakeCurrentPerfCase::Spec::toName (void) const
{
	ostringstream name;

	name << "context";

	if (contextCount > 1)
		name << "s_" << contextCount;

	if ((surfaceTypes & SURFACETYPE_WINDOW) != 0)
		name << "_window" << (surfaceCount > 1 ? "s" : "");

	if ((surfaceTypes & SURFACETYPE_PIXMAP) != 0)
		name << "_pixmap" << (surfaceCount > 1 ? "s" : "");

	if ((surfaceTypes & SURFACETYPE_PBUFFER) != 0)
		name << "_pbuffer" << (surfaceCount > 1 ? "s" : "");

	if (surfaceCount > 1)
		name << "_" << surfaceCount;

	if (release)
		name << "_release";

	return name.str();
}